

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::RadixHTLocalSourceState::RadixHTLocalSourceState
          (RadixHTLocalSourceState *this,ExecutionContext *context,
          RadixPartitionedHashTable *radix_ht)

{
  pointer pLVar1;
  vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  *pvVar2;
  type this_00;
  Allocator *pAVar3;
  LogicalType *aggr_type;
  pointer __x;
  pointer *__ptr;
  vector<duckdb::LogicalType,_true> scan_chunk_types;
  vector<duckdb::LogicalType,_true> local_48;
  
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__RadixHTLocalSourceState_0243f588;
  this->task = NO_TASK;
  this->task_idx = 0xffffffffffffffff;
  (this->ht).
  super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
       (GroupedAggregateHashTable *)0x0;
  this->scan_status = DONE;
  this_00 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(&radix_ht->layout_ptr);
  TupleDataLayout::Copy(&this->layout,this_00);
  pAVar3 = BufferAllocator::Get(context->client);
  ArenaAllocator::ArenaAllocator(&this->aggregate_allocator,pAVar3,0x800);
  (this->row_state).allocator = &this->aggregate_allocator;
  *(undefined1 (*) [16])&(this->row_state).addresses = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->scan_state).pin_state.row_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl + 8) = (undefined1  [16])0x0;
  pvVar2 = &(this->scan_state).pin_state.heap_handles.handles.
            super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  ;
  (pvVar2->
  super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->scan_state).pin_state.heap_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl + 9) = (undefined1  [16])0x0;
  TupleDataChunkState::TupleDataChunkState(&(this->scan_state).chunk_state);
  *(undefined4 *)&(this->scan_state).segment_index = 0xffffffff;
  *(undefined4 *)((long)&(this->scan_state).segment_index + 4) = 0xffffffff;
  *(undefined4 *)&(this->scan_state).chunk_index = 0xffffffff;
  *(undefined4 *)((long)&(this->scan_state).chunk_index + 4) = 0xffffffff;
  DataChunk::DataChunk(&this->scan_chunk);
  pAVar3 = BufferAllocator::Get(context->client);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48,
             &(radix_ht->group_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  __x = (radix_ht->op->aggregate_return_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start;
  pLVar1 = (radix_ht->op->aggregate_return_types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__x != pLVar1) {
    do {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48,__x)
      ;
      __x = __x + 1;
    } while (__x != pLVar1);
  }
  DataChunk::Initialize(&this->scan_chunk,pAVar3,&local_48,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  return;
}

Assistant:

RadixHTLocalSourceState::RadixHTLocalSourceState(ExecutionContext &context, const RadixPartitionedHashTable &radix_ht)
    : task(RadixHTSourceTaskType::NO_TASK), task_idx(DConstants::INVALID_INDEX), scan_status(RadixHTScanStatus::DONE),
      layout(radix_ht.GetLayout().Copy()), aggregate_allocator(BufferAllocator::Get(context.client)),
      row_state(aggregate_allocator) {
	auto &allocator = BufferAllocator::Get(context.client);
	auto scan_chunk_types = radix_ht.group_types;
	for (auto &aggr_type : radix_ht.op.aggregate_return_types) {
		scan_chunk_types.push_back(aggr_type);
	}
	scan_chunk.Initialize(allocator, scan_chunk_types);
}